

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

void __thiscall fasttext::FastText::abort(FastText *this)

{
  void *__tmp;
  runtime_error *this_00;
  
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Aborted.");
  *(undefined ***)this_00 = &PTR__runtime_error_00136678;
  __cxa_throw(this_00,&AbortError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void FastText::abort() {
  try {
    throw AbortError();
  } catch (AbortError&) {
    trainException_ = std::current_exception();
  }
}